

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentRecord.cpp
# Opt level: O2

void __thiscall
AlignmentRecord::getMergedDnaSequence
          (AlignmentRecord *this,BamAlignment *alignment,string *mainReference)

{
  vector<char,_std::allocator<char>_> *cigar;
  value_type *pvVar1;
  pointer pcVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  size_t sVar8;
  uint s;
  uint uVar9;
  int iVar10;
  AlignmentRecord *this_00;
  AlignmentRecord *pAVar11;
  value_type *__x;
  size_type sVar12;
  int ref_s_pos2;
  int ref_s_pos1;
  int c_pos1;
  int q_pos1;
  AlignmentRecord *local_238;
  int c_pos2;
  int q_pos2;
  AlignmentRecord *local_228;
  undefined1 local_21c [4];
  string qualities;
  string nucigar;
  string dna;
  vector<char,_std::allocator<char>_> cigar_temp_unrolled;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
  ref;
  _Vector_base<char,_std::allocator<char>_> local_130;
  ShortDnaSequence local_118;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_238 = (AlignmentRecord *)alignment;
  std::__cxx11::string::string((string *)&dna,"",(allocator *)&ref);
  std::__cxx11::string::string((string *)&qualities,"",(allocator *)&ref);
  std::__cxx11::string::string((string *)&nucigar,"",(allocator *)&ref);
  cigar_temp_unrolled.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cigar_temp_unrolled.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  cigar_temp_unrolled.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pvVar1 = (value_type *)(local_238->al_sequence1).field_2._M_allocated_capacity;
  for (__x = (value_type *)(local_238->al_sequence1)._M_string_length; __x != pvVar1; __x = __x + 8)
  {
    for (uVar9 = 0; uVar9 < *(uint *)(__x + 4); uVar9 = uVar9 + 1) {
      std::vector<char,_std::allocator<char>_>::push_back(&cigar_temp_unrolled,__x);
    }
  }
  cigar = &this->cigar1_unrolled;
  iVar3 = computeOffset(cigar);
  iVar4 = computeOffset(&cigar_temp_unrolled);
  iVar5 = computeRevOffset(cigar);
  iVar6 = computeRevOffset(&cigar_temp_unrolled);
  iVar3 = this->start1 - iVar3;
  iVar5 = iVar5 + this->end1;
  iVar10 = (*(int *)((long)&(local_238->sequence1).backward_qualities.pn.pi_ + 4) - iVar4) + 1;
  pAVar11 = local_238;
  ref_s_pos2 = iVar10;
  ref_s_pos1 = iVar3;
  local_228 = this;
  iVar4 = BamTools::BamAlignment::GetEndPosition(SUB81(local_238,0),false);
  q_pos1 = 0;
  q_pos2 = 0;
  iVar4 = iVar4 + iVar6;
  c_pos1 = 0;
  c_pos2 = 0;
  if ((iVar10 < iVar3) || (iVar4 < iVar5)) {
    if ((iVar10 < iVar3) || (iVar5 < iVar4)) {
      if ((iVar3 < iVar10) || (iVar4 < iVar5)) {
        while (ref_s_pos2 < iVar3) {
          noOverlapMerge((AlignmentRecord *)&q_pos2,(BamAlignment *)local_238,&dna,&qualities,
                         &nucigar,&cigar_temp_unrolled,&c_pos2,&q_pos2,&ref_s_pos2);
        }
        while (ref_s_pos2 <= iVar4) {
          overlapMerge(local_228,(BamAlignment *)local_238,&dna,&qualities,&nucigar,
                       &cigar_temp_unrolled,&c_pos1,&c_pos2,&q_pos1,&q_pos2,&ref_s_pos2);
        }
        while (ref_s_pos2 <= iVar5) {
          noOverlapMergeBAM(local_228,&dna,&qualities,&nucigar,&c_pos1,&q_pos1,&ref_s_pos2,1);
        }
      }
      else {
        local_21c = (undefined1  [4])iVar4;
        while (ref_s_pos2 < iVar3) {
          noOverlapMerge(pAVar11,(BamAlignment *)local_238,&dna,&qualities,&nucigar,
                         &cigar_temp_unrolled,&c_pos2,&q_pos2,&ref_s_pos2);
        }
        while (ref_s_pos2 <= iVar5) {
          pAVar11 = local_228;
          overlapMerge(local_228,(BamAlignment *)local_238,&dna,&qualities,&nucigar,
                       &cigar_temp_unrolled,&c_pos1,&c_pos2,&q_pos1,&q_pos2,&ref_s_pos2);
        }
        while (ref_s_pos2 <= (int)local_21c) {
          noOverlapMerge(pAVar11,(BamAlignment *)local_238,&dna,&qualities,&nucigar,
                         &cigar_temp_unrolled,&c_pos2,&q_pos2,&ref_s_pos2);
        }
      }
    }
    else {
      while (ref_s_pos1 < iVar10) {
        noOverlapMergeBAM(local_228,&dna,&qualities,&nucigar,&c_pos1,&q_pos1,&ref_s_pos1,1);
      }
      while (ref_s_pos1 <= iVar4) {
        overlapMerge(local_228,(BamAlignment *)local_238,&dna,&qualities,&nucigar,
                     &cigar_temp_unrolled,&c_pos1,&c_pos2,&q_pos1,&q_pos2,&ref_s_pos1);
      }
      while (ref_s_pos1 <= iVar5) {
        noOverlapMergeBAM(local_228,&dna,&qualities,&nucigar,&c_pos1,&q_pos1,&ref_s_pos1,1);
      }
    }
  }
  else {
    local_21c = (undefined1  [4])iVar4;
    while (ref_s_pos1 < iVar10) {
      pAVar11 = local_228;
      noOverlapMergeBAM(local_228,&dna,&qualities,&nucigar,&c_pos1,&q_pos1,&ref_s_pos1,1);
    }
    while (ref_s_pos1 <= iVar5) {
      pAVar11 = local_228;
      overlapMerge(local_228,(BamAlignment *)local_238,&dna,&qualities,&nucigar,&cigar_temp_unrolled
                   ,&c_pos1,&c_pos2,&q_pos1,&q_pos2,&ref_s_pos1);
    }
    while (ref_s_pos1 <= (int)local_21c) {
      noOverlapMerge(pAVar11,(BamAlignment *)local_238,&dna,&qualities,&nucigar,&cigar_temp_unrolled
                     ,&c_pos2,&q_pos2,&ref_s_pos1);
    }
  }
  pAVar11 = local_228;
  uVar9 = *(int *)((long)&(local_238->sequence1).backward_qualities.pn.pi_ + 4) + 1;
  if (local_228->start1 <= uVar9) {
    uVar9 = local_228->start1;
  }
  local_228->start1 = uVar9;
  uVar7 = BamTools::BamAlignment::GetEndPosition(SUB81(local_238,0),false);
  uVar9 = pAVar11->end1;
  if (pAVar11->end1 < uVar7) {
    uVar9 = uVar7;
  }
  pAVar11->end1 = uVar9;
  pAVar11->single_end = true;
  createCigar((vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)&ref,&nucigar);
  std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::_M_move_assign
            (&pAVar11->cigar1,&ref);
  std::_Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::~_Vector_base
            ((_Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)&ref);
  iVar3 = phred_sum(&qualities,'!');
  pAVar11->phred_sum1 = iVar3;
  pcVar2 = (pAVar11->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((pAVar11->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish != pcVar2) {
    (pAVar11->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_finish = pcVar2;
  }
  for (sVar12 = 0; nucigar._M_string_length != sVar12; sVar12 = sVar12 + 1) {
    ref.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
    .
    super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
    .super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
    super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start._0_1_ =
         nucigar._M_dataplus._M_p[sVar12];
    std::vector<char,_std::allocator<char>_>::push_back(cigar,(value_type *)&ref);
  }
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&local_130,cigar);
  iVar3 = *(int *)((long)&(local_238->sequence1).backward_qualities.pn.pi_ + 4);
  this_00 = (AlignmentRecord *)&qualities;
  std::__cxx11::string::string((string *)&local_50,(string *)this_00);
  referenceString(&ref,this_00,(vector<char,_std::allocator<char>_> *)&local_130,iVar3,&dna,
                  &local_50,mainReference);
  std::__cxx11::string::~string((string *)&local_50);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_130);
  if (pAVar11->strand1 == false) {
    std::__cxx11::string::string((string *)&local_90,(string *)&dna);
    complement(&local_70,&local_90);
    ShortDnaSequence::ShortDnaSequence(&local_118,&local_70,&qualities);
    ShortDnaSequence::operator=(&pAVar11->sequence1,&local_118);
    ShortDnaSequence::~ShortDnaSequence(&local_118);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::string
              ((string *)&local_b0,
               (string *)
               &ref.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
              );
    complement((string *)&local_118,&local_b0);
    std::__cxx11::string::operator=((string *)&pAVar11->reference_seq1,(string *)&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::string
              ((string *)&local_d0,
               (string *)
               &ref.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                .
                super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                .
                super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
              );
    complement((string *)&local_118,&local_d0);
    std::__cxx11::string::operator=((string *)&pAVar11->alignSequence1,(string *)&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  else {
    ShortDnaSequence::ShortDnaSequence(&local_118,&dna,&qualities);
    ShortDnaSequence::operator=(&pAVar11->sequence1,&local_118);
    ShortDnaSequence::~ShortDnaSequence(&local_118);
    std::__cxx11::string::_M_assign((string *)&pAVar11->reference_seq1);
    std::__cxx11::string::_M_assign((string *)&pAVar11->alignSequence1);
  }
  std::vector<int,_std::allocator<int>_>::operator=
            (&pAVar11->qualityList1,(vector<int,_std::allocator<int>_> *)&ref);
  sVar8 = ShortDnaSequence::size(&pAVar11->sequence1);
  pAVar11->length_incl_deletions1 = (int)sVar8;
  sVar8 = ShortDnaSequence::size(&pAVar11->sequence1);
  pAVar11->length_incl_longdeletions1 = (int)sVar8;
  coveredPositions((vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_> *)
                   &local_118,pAVar11);
  std::vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>::_M_move_assign
            (&pAVar11->cov_pos,&local_118);
  std::_Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>::
  ~_Vector_base((_Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>
                 *)&local_118);
  std::
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
  ::~_Tuple_impl(&ref.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                );
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&cigar_temp_unrolled.super__Vector_base<char,_std::allocator<char>_>);
  std::__cxx11::string::~string((string *)&nucigar);
  std::__cxx11::string::~string((string *)&qualities);
  std::__cxx11::string::~string((string *)&dna);
  return;
}

Assistant:

void AlignmentRecord::getMergedDnaSequence(const BamTools::BamAlignment& alignment,string & mainReference){
        std::string dna = "";
        std::string qualities = "";
        std::string nucigar = "";
        std::vector<char> cigar_temp_unrolled;
        //vector of CigarOp
        for (const auto& it : alignment.CigarData) {
            for (unsigned int s = 0; s < it.Length; ++s) {
                cigar_temp_unrolled.push_back(it.Type);
            }
        }
        //get starting position and ending position according to ref position, paying attention to clipped bases
        int offset_f1 = computeOffset(this->cigar1_unrolled);
        int offset_f2 = computeOffset(cigar_temp_unrolled);
        int offset_b1 = computeRevOffset(this->cigar1_unrolled);
        int offset_b2 = computeRevOffset(cigar_temp_unrolled);

        //updated ref position including clips
        int ref_s_pos1 = this->start1-offset_f1;
        int ref_e_pos1 = this->end1+offset_b1;
        int ref_s_pos2 = alignment.Position+1-offset_f2;
        int ref_e_pos2 = alignment.GetEndPosition()+offset_b2;
        //position in query sequences // phred scores
        int q_pos1 = 0;
        int q_pos2 = 0;
        //position in unrolled cigar vectors
        int c_pos1 = 0;
        int c_pos2 = 0;
        //4 cases of different overlaps
        //------------
        //     ------------
        if(ref_s_pos1 <= ref_s_pos2 && ref_e_pos1 <= ref_e_pos2){
            while(ref_s_pos1<ref_s_pos2){
                noOverlapMergeBAM(dna,qualities,nucigar,c_pos1,q_pos1,ref_s_pos1,1);
            }
            while(ref_s_pos1<=ref_e_pos1){
                overlapMerge(alignment,dna,qualities,nucigar,cigar_temp_unrolled,c_pos1,c_pos2,q_pos1,q_pos2,ref_s_pos1);
            }
            while(ref_s_pos1<=ref_e_pos2){
                noOverlapMerge(alignment, dna, qualities, nucigar, cigar_temp_unrolled, c_pos2, q_pos2, ref_s_pos1);
            }
        }//------------------------------
            //           ----------
         else if (ref_s_pos1 <= ref_s_pos2 && ref_e_pos1 >= ref_e_pos2){
            while(ref_s_pos1<ref_s_pos2){
                noOverlapMergeBAM(dna,qualities,nucigar,c_pos1,q_pos1,ref_s_pos1,1);
            }
            while(ref_s_pos1<=ref_e_pos2){
                overlapMerge(alignment,dna,qualities,nucigar,cigar_temp_unrolled,c_pos1,c_pos2,q_pos1,q_pos2,ref_s_pos1);
            }
            while(ref_s_pos1<=ref_e_pos1){
                noOverlapMergeBAM(dna,qualities,nucigar,c_pos1,q_pos1,ref_s_pos1,1);
            }
            //         ----------
            //--------------------------
        } else if (ref_s_pos1 >= ref_s_pos2 && ref_e_pos1 <= ref_e_pos2){
            while(ref_s_pos2<ref_s_pos1){
                noOverlapMerge(alignment, dna, qualities, nucigar, cigar_temp_unrolled, c_pos2, q_pos2, ref_s_pos2);
            }
            while(ref_s_pos2<=ref_e_pos1){
                overlapMerge(alignment,dna,qualities,nucigar,cigar_temp_unrolled,c_pos1,c_pos2,q_pos1,q_pos2,ref_s_pos2);
            }
            while(ref_s_pos2<=ref_e_pos2){
                noOverlapMerge(alignment, dna, qualities, nucigar, cigar_temp_unrolled, c_pos2, q_pos2, ref_s_pos2);
            }
            //           --------------------
            //---------------------
        } else {
            assert(ref_s_pos1 >= ref_s_pos2 && ref_e_pos1 >= ref_e_pos2);
            while(ref_s_pos2<ref_s_pos1){
                noOverlapMerge(alignment, dna, qualities, nucigar, cigar_temp_unrolled, c_pos2, q_pos2, ref_s_pos2);
            }
            while(ref_s_pos2<=ref_e_pos2){
                overlapMerge(alignment,dna,qualities,nucigar,cigar_temp_unrolled,c_pos1,c_pos2,q_pos1,q_pos2,ref_s_pos2);
            }
            while(ref_s_pos2<=ref_e_pos1){
                noOverlapMergeBAM(dna,qualities,nucigar,c_pos1,q_pos1,ref_s_pos2,1);
            }
        }
        this->start1 = std::min(this->start1,(unsigned int)alignment.Position+1);
        this->end1=std::max((unsigned int)alignment.GetEndPosition(),this->end1);
        this->single_end= true;
        this->cigar1 = createCigar(nucigar);

        this->phred_sum1=phred_sum(qualities);

        this->cigar1_unrolled.clear();
        for (char i : nucigar){
            this->cigar1_unrolled.push_back(i);
        }

        //NoMe Additions
        std::tuple<string,string,vector<int>> ref = referenceString(this->getCigar1Unrolled(),alignment.Position,dna,qualities,mainReference);
        if(!this->strand1){
           this->sequence1 = ShortDnaSequence(complement(dna), qualities);
           this->reference_seq1=complement(std::get<0>(ref));
           this->alignSequence1=complement(std::get<1>(ref));
            this->qualityList1 = std::get<2>(ref);
        }else{
           this->sequence1=ShortDnaSequence(dna,qualities);
           this->reference_seq1=std::get<0>(ref);
           this->alignSequence1=std::get<1>(ref);
            this->qualityList1 = std::get<2>(ref);
        }
        //fill out thr frs ffs thing here

        this->length_incl_deletions1 = this->sequence1.size();
        this->length_incl_longdeletions1 = this->sequence1.size();
        //End NoMe Additions
        //this->strandInfo = this->determineStrand(this->alignSequence1,this->reference_seq1);
        this->cov_pos = this->coveredPositions();
}